

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::resetScaleFactorsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int cumulativeScalingIndex,int partitionIndex)

{
  int iVar1;
  long lVar2;
  
  if ((this->kFlags & 0x80) == 0) {
    iVar1 = 0;
    lVar2 = (long)this->gPatternPartitionsStartPatterns[partitionIndex];
    memset(this->gScaleBuffers[cumulativeScalingIndex] + lVar2,0,
           (this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1] - lVar2) * 4);
  }
  else {
    iVar1 = -7;
  }
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::resetScaleFactorsByPartition(int cumulativeScalingIndex,
                                                                    int partitionIndex) {

     if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
     } else {
        int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
        int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

        REALTYPE* cumulativeBuffer = gScaleBuffers[cumulativeScalingIndex];

        memset(&cumulativeBuffer[startPattern], 0, sizeof(REALTYPE) * (endPattern - startPattern));
     }
    return BEAGLE_SUCCESS;
}